

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

int __thiscall notch::core::Net::init(Net *this,EVP_PKEY_CTX *ctx)

{
  pointer psVar1;
  long *plVar2;
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  *in_RDX;
  ulong uVar3;
  long lVar4;
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  local_50;
  
  lVar4 = 0;
  for (uVar3 = 0;
      psVar1 = (this->layers).
               super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->layers).
                            super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar3 = uVar3 + 1) {
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar4);
    std::
    function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
    ::function(&local_50,in_RDX);
    (**(code **)(*plVar2 + 0x18))(plVar2,ctx,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    lVar4 = lVar4 + 0x10;
  }
  return (int)psVar1;
}

Assistant:

virtual void
    init(std::unique_ptr<RNG> &rng, WeightInit init = Init::normalXavier) {
        for (size_t i = 0u; i < layers.size(); ++i) {
            layers[i]->init(rng, init);
        }
    }